

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O2

string * __thiscall
ArrayType::sizeToString_abi_cxx11_(string *__return_storage_ptr__,ArrayType *this)

{
  ArrayType *this_00;
  string local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::to_string(&local_30,this->size);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  this_00 = (ArrayType *)this->type;
  if ((this_00 != (ArrayType *)0x0) && ((this_00->super_Type).kind == TK_ArrayType)) {
    sizeToString_abi_cxx11_(&local_30,this_00);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ArrayType::sizeToString() const {
    std::string ret;

    ret += "[";
    ret += std::to_string(size);
    ret += "]";
    if (ArrayType* AT = llvm::dyn_cast_or_null<ArrayType>(type)) {
        ret += AT->sizeToString();
    }

    return ret;
}